

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

void __thiscall CoreML::ShapeConstraint::updateConstraint(ShapeConstraint *this,FeatureType *type)

{
  uint32 uVar1;
  ulong uVar2;
  Rep *pRVar3;
  ImageFeatureType *pIVar4;
  ImageFeatureType_EnumeratedImageSizes *pIVar5;
  Type *pTVar6;
  ArrayFeatureType *pAVar7;
  ArrayFeatureType_ShapeRange *pAVar8;
  Type *range;
  ArrayFeatureType_EnumeratedShapes *pAVar9;
  Type *this_00;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  ImageFeatureType_ImageSizeRange *pIVar13;
  runtime_error *prVar14;
  void **ppvVar15;
  int i_1;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  SizeRange *pSVar19;
  int i_2;
  int index;
  int i;
  int iVar20;
  ulong min;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> ranges;
  ShapeRange widthRange;
  ShapeRange heightRange;
  
  if (type->_oneof_case_[0] == 5) {
    ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pAVar7 = Specification::FeatureType::multiarraytype(type);
    if (pAVar7->_oneof_case_[0] == 0x15) {
      pAVar7 = Specification::FeatureType::multiarraytype(type);
      pAVar9 = Specification::ArrayFeatureType::enumeratedshapes(pAVar7);
      pRVar3 = (pAVar9->shapes_).super_RepeatedPtrFieldBase.rep_;
      ppvVar15 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar15 = (void **)0x0;
      }
      iVar20 = 0;
      for (lVar11 = 0;
          (long)(pAVar9->shapes_).super_RepeatedPtrFieldBase.current_size_ * 8 != lVar11;
          lVar11 = lVar11 + 8) {
        iVar18 = *(int *)(*(long *)((long)ppvVar15 + lVar11) + 0x10);
        if (iVar20 < iVar18) {
          iVar20 = iVar18;
        }
      }
      iVar18 = 0;
      if (iVar20 < 1) {
        iVar20 = 0;
        iVar18 = 0;
      }
      for (; iVar18 != iVar20; iVar18 = iVar18 + 1) {
        uVar16 = 0;
        uVar17 = 0xffffffffffffffff;
        index = 0;
        while( true ) {
          pAVar7 = Specification::FeatureType::multiarraytype(type);
          pAVar9 = Specification::ArrayFeatureType::enumeratedshapes(pAVar7);
          if ((pAVar9->shapes_).super_RepeatedPtrFieldBase.current_size_ <= index) break;
          pAVar7 = Specification::FeatureType::multiarraytype(type);
          pAVar9 = Specification::ArrayFeatureType::enumeratedshapes(pAVar7);
          this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                              (&(pAVar9->shapes_).super_RepeatedPtrFieldBase,index);
          uVar10 = Specification::ArrayFeatureType_Shape::shape(this_00,iVar18);
          if (uVar10 <= uVar17) {
            uVar17 = uVar10;
          }
          if (uVar16 <= uVar10) {
            uVar16 = uVar10;
          }
          index = index + 1;
        }
        ShapeRange::ShapeRange(&widthRange,uVar17,uVar16);
        std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::
        emplace_back<CoreML::ShapeRange>(&ranges,&widthRange);
      }
    }
    else if (pAVar7->_oneof_case_[0] == 0x1f) {
      iVar20 = 0;
      while( true ) {
        pAVar7 = Specification::FeatureType::multiarraytype(type);
        pAVar8 = Specification::ArrayFeatureType::shaperange(pAVar7);
        if ((pAVar8->sizeranges_).super_RepeatedPtrFieldBase.current_size_ <= iVar20) break;
        pAVar7 = Specification::FeatureType::multiarraytype(type);
        pAVar8 = Specification::ArrayFeatureType::shaperange(pAVar7);
        range = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                          (&(pAVar8->sizeranges_).super_RepeatedPtrFieldBase,iVar20);
        ShapeRange::ShapeRange(&widthRange,range);
        std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::
        emplace_back<CoreML::ShapeRange>(&ranges,&widthRange);
        iVar20 = iVar20 + 1;
      }
    }
    lVar11 = (long)ranges.
                   super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)ranges.
                   super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5;
    if (lVar11 == 0) {
      pAVar7 = Specification::FeatureType::multiarraytype(type);
      sVar12 = Specification::ArrayFeatureType::shape(pAVar7,0);
      ShapeRange::setValue(&this->_channelRange,sVar12);
      pAVar7 = Specification::FeatureType::multiarraytype(type);
      if ((pAVar7->shape_).current_size_ == 3) {
        pAVar7 = Specification::FeatureType::multiarraytype(type);
        sVar12 = Specification::ArrayFeatureType::shape(pAVar7,1);
        ShapeRange::setValue(&this->_heightRange,sVar12);
        pAVar7 = Specification::FeatureType::multiarraytype(type);
        sVar12 = Specification::ArrayFeatureType::shape(pAVar7,2);
      }
      else {
        sVar12 = 1;
        ShapeRange::setValue(&this->_heightRange,1);
      }
      ShapeRange::setValue(&this->_widthRange,sVar12);
    }
    else if (lVar11 == 3) {
      updateChannelRange(this,ranges.
                              super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      updateHeightRange(this,ranges.
                             super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1);
      updateWidthRange(this,ranges.
                            super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                            ._M_impl.super__Vector_impl_data._M_start + 2);
    }
    else {
      if (lVar11 != 1) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &heightRange,"Attempting to constrain an input or output feature \"",
                       &this->_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &widthRange,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &heightRange,"\" with an invalid array shape constraint.");
        std::runtime_error::runtime_error(prVar14,(string *)&widthRange);
        __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      updateChannelRange(this,ranges.
                              super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    }
    std::_Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::~_Vector_base
              (&ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>);
  }
  else {
    if (type->_oneof_case_[0] != 4) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &heightRange,"Attempting to update feature constraint ",&this->_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &widthRange,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &heightRange," with a type description which is not a multi array or image.");
      std::runtime_error::runtime_error(prVar14,(string *)&widthRange);
      __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pIVar4 = Specification::FeatureType::imagetype(type);
    ShapeRange::setValue(&this->_channelRange,(ulong)(pIVar4->colorspace_ != 10) * 2 + 1);
    pIVar4 = Specification::FeatureType::imagetype(type);
    uVar1 = pIVar4->_oneof_case_[0];
    if (uVar1 == 0) {
      pIVar4 = Specification::FeatureType::imagetype(type);
      ShapeRange::setValue(&this->_heightRange,pIVar4->height_);
      pIVar4 = Specification::FeatureType::imagetype(type);
      ShapeRange::setValue(&this->_widthRange,pIVar4->width_);
      return;
    }
    if (uVar1 == 0x1f) {
      pIVar4 = Specification::FeatureType::imagetype(type);
      pIVar13 = Specification::ImageFeatureType::imagesizerange(pIVar4);
      pSVar19 = pIVar13->widthrange_;
      if (pSVar19 == (SizeRange *)0x0) {
        pSVar19 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      ShapeRange::ShapeRange(&widthRange,pSVar19);
      updateWidthRange(this,&widthRange);
      pIVar4 = Specification::FeatureType::imagetype(type);
      pIVar13 = Specification::ImageFeatureType::imagesizerange(pIVar4);
      pSVar19 = pIVar13->heightrange_;
      if (pSVar19 == (SizeRange *)0x0) {
        pSVar19 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      ShapeRange::ShapeRange(&heightRange,pSVar19);
    }
    else {
      if (uVar1 != 0x15) {
        return;
      }
      uVar17 = 0xffffffffffffffff;
      iVar20 = 0;
      uVar10 = 0;
      uVar16 = 0;
      min = uVar17;
      while( true ) {
        pIVar4 = Specification::FeatureType::imagetype(type);
        pIVar5 = Specification::ImageFeatureType::enumeratedsizes(pIVar4);
        if ((pIVar5->sizes_).super_RepeatedPtrFieldBase.current_size_ <= iVar20) break;
        pIVar4 = Specification::FeatureType::imagetype(type);
        pIVar5 = Specification::ImageFeatureType::enumeratedsizes(pIVar4);
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                           (&(pIVar5->sizes_).super_RepeatedPtrFieldBase,iVar20);
        uVar2 = pTVar6->width_;
        if (uVar16 < uVar2) {
          uVar16 = uVar2;
        }
        if (uVar2 < uVar17) {
          uVar17 = uVar2;
        }
        pIVar4 = Specification::FeatureType::imagetype(type);
        pIVar5 = Specification::ImageFeatureType::enumeratedsizes(pIVar4);
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                           (&(pIVar5->sizes_).super_RepeatedPtrFieldBase,iVar20);
        uVar2 = pTVar6->height_;
        if (uVar10 < uVar2) {
          uVar10 = uVar2;
        }
        if (uVar2 < min) {
          min = uVar2;
        }
        iVar20 = iVar20 + 1;
      }
      ShapeRange::ShapeRange(&widthRange,uVar17,uVar16);
      updateWidthRange(this,&widthRange);
      ShapeRange::ShapeRange(&heightRange,min,uVar10);
    }
    updateHeightRange(this,&heightRange);
  }
  return;
}

Assistant:

void ShapeConstraint::updateConstraint(const Specification::FeatureType& type) {

    if (type.Type_case() == Specification::FeatureType::kImageType) {

        // Handle the number of channels first
        if (type.imagetype().colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE)
            setChannel(1);
        else {
            setChannel(3);
        }

        switch (type.imagetype().SizeFlexibility_case()) {

            case CoreML::Specification::ImageFeatureType::kEnumeratedSizes: {

                size_t min_width = SIZE_MAX;
                size_t max_width = 0;
                size_t min_height = SIZE_MAX;
                size_t max_height = 0;
                for (int i = 0; i < type.imagetype().enumeratedsizes().sizes_size(); i++) {
                    size_t width = (size_t)type.imagetype().enumeratedsizes().sizes(i).width();
                    if (width > max_width)
                        max_width = width;
                    if (width < min_width)
                        min_width = width;

                    size_t height = (size_t)type.imagetype().enumeratedsizes().sizes(i).height();
                    if (height > max_height)
                        max_height = height;
                    if (height < min_height)
                        min_height = height;
                }

                // This is a hack, in that it loses the numerated nature of the constraint
                ShapeRange widthRange = ShapeRange(min_width, max_width);
                updateWidthRange(widthRange);

                ShapeRange heightRange = ShapeRange(min_height, max_height);
                updateHeightRange(heightRange);

                break;
            }
            case CoreML::Specification::ImageFeatureType::kImageSizeRange: {

                ShapeRange allowedWidths(type.imagetype().imagesizerange().widthrange());
                updateWidthRange(allowedWidths);

                ShapeRange allowedHeights(type.imagetype().imagesizerange().heightrange());
                updateHeightRange(allowedHeights);

                break;
            }
            case CoreML::Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET: {
                // the back compatible portion -- if the shape isn't set, then we'll use the old fields
                setHeight(static_cast<size_t>(type.imagetype().height()));
                setWidth(static_cast<size_t>(type.imagetype().width()));

                break;
            }

        } // switch

    } // is an image
    else if (type.Type_case() == Specification::FeatureType::kMultiArrayType) {

        std::vector<ShapeRange> ranges;

        switch (type.multiarraytype().ShapeFlexibility_case()) {

            case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes: {
                int maxDims = 0;
                for (const auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                    if (shape.shape_size() > maxDims) {
                        maxDims = shape.shape_size();
                    }
                }
                for (int d=0; d<maxDims; d++) {
                    size_t minSize = SIZE_MAX;
                    size_t maxSize = 0;
                    for (int i = 0; i < type.multiarraytype().enumeratedshapes().shapes_size(); i++) {
                        size_t size = static_cast<size_t>(type.multiarraytype().enumeratedshapes().shapes(i).shape(d));
                        if (minSize > size)
                            minSize = size;
                        if (maxSize < size)
                            maxSize = size;
                    }
                    ranges.push_back(ShapeRange(minSize,maxSize));
                }
                break;
            }
            case CoreML::Specification::ArrayFeatureType::kShapeRange: {
                for (int i = 0; i < type.multiarraytype().shaperange().sizeranges_size(); i++) {
                    ranges.push_back(ShapeRange(type.multiarraytype().shaperange().sizeranges(i)));
                }
                break;
            }
            case  CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                break;
        }

        if (ranges.size() == 1) {
            updateChannelRange(ranges[0]);
        }
        else if (ranges.size() == 3) {
            updateChannelRange(ranges[0]);
            updateHeightRange(ranges[1]);
            updateWidthRange(ranges[2]);
        }
        else if (ranges.size() == 0) {
            // legacy case for older models.
            setChannel(static_cast<size_t>(type.multiarraytype().shape(0)));
            if (type.multiarraytype().shape_size() == 3) {
                setHeight(static_cast<size_t>(type.multiarraytype().shape(1)));
                setWidth(static_cast<size_t>(type.multiarraytype().shape(2)));
            }
            else {
                setHeight(1);
                setWidth(1);
            }
        }
        else {
            throw std::runtime_error("Attempting to constrain an input or output feature \"" + _name + "\" with an invalid array shape constraint.");
        }

    }
    else {
        throw std::runtime_error("Attempting to update feature constraint " + _name + " with a type description which is not a multi array or image.");
    }

}